

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3Extension_Test::TestBody
          (ValidationErrorTest_ValidateProto3Extension_Test *this)

{
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  InternalMetadata arena;
  char *in_R9;
  char *expected_predicate_value;
  string_view file_text;
  AssertHelper AStack_1e8;
  Message local_1e0;
  string local_1d8;
  AssertionResult gtest_ar_;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  FileDescriptorProto file_proto;
  DescriptorPool pool;
  
  DescriptorPool::DescriptorPool(&pool);
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  pDVar1 = FileDescriptorProto::GetDescriptor();
  FileDescriptor::CopyTo(pDVar1->file_,&file_proto);
  pFVar2 = DescriptorPool::BuildFile(&pool,&file_proto);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pFVar2 != (FileDescriptor *)0x0;
  if (pFVar2 == (FileDescriptor *)0x0) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&gtest_ar_,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1ee2,local_1d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_1e8,&local_1e0);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    FileDescriptorProto::Clear(&file_proto);
    file_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         file_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
    arena = file_proto.super_Message.super_MessageLite._internal_metadata_;
    if ((file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena.ptr_ = *(undefined8 *)
                    (file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                    0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&file_proto.field_0._impl_.name_,"foo.proto",(Arena *)arena.ptr_);
    file_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         file_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
    if ((file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
            0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&file_proto.field_0._impl_.syntax_,"proto3",
               (Arena *)file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_);
    internal::AddToRepeatedPtrField<char_const(&)[33]>
              (&file_proto.field_0._impl_.dependency_,(char (*) [33])0xe812b9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.FileOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_file_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3e9,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.MessageOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_msg_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3e9,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.FieldOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_field_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3eb,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.EnumOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_enum_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3ec,
                 FieldDescriptorProto_Label_LABEL_REPEATED,FieldDescriptorProto_Type_TYPE_INT32);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.EnumValueOptions",(allocator<char> *)&local_1e0
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_enumval_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3ed,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_INT32);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.ServiceOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_svc_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3ee,
                 FieldDescriptorProto_Label_LABEL_REPEATED,FieldDescriptorProto_Type_TYPE_INT32);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.MethodOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_method_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3ef,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.OneofOptions",(allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_oneof_opt",(allocator<char> *)&AStack_1e8);
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3f0,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"google.protobuf.ExtensionRangeOptions",
               (allocator<char> *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test_ext_opt",(allocator<char> *)&AStack_1e8);
    expected_predicate_value = &DAT_00000009;
    AddExtension(&file_proto,&local_1d8,(string *)&gtest_ar_,0x3f1,
                 FieldDescriptorProto_Label_LABEL_OPTIONAL,FieldDescriptorProto_Type_TYPE_STRING);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_1d8);
    pFVar2 = DescriptorPool::BuildFile(&pool,&file_proto);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = pFVar2 != (FileDescriptor *)0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      file_text._M_str =
           "name: \'google.protobuf.proto\' syntax: \'proto2\' message_type {   name: \'Container\' extension_range { start: 1 end: 1000 } }"
      ;
      file_text._M_len = 0x7a;
      ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,
                 "name: \'bar.proto\' syntax: \'proto3\' dependency: \'google.protobuf.proto\' extension {   name: \'bar\' number: 1 label: LABEL_OPTIONAL type: TYPE_INT32   extendee: \'Container\' }"
                 ,(allocator<char> *)&gtest_ar_);
      testing::
      Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_198,
              "bar.proto: bar: EXTENDEE: Extensions in proto3 are only allowed for defining options.\n"
             );
      ValidationErrorTest::BuildFileWithErrors
                (&this->super_ValidationErrorTest,&local_1d8,
                 (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198);
      testing::internal::
      MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~MatcherBase(&local_198);
      std::__cxx11::string::~string((string *)&local_1d8);
      goto LAB_004888b2;
    }
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&gtest_ar_,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1f1f,local_1d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_1e8,&local_1e0);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_1e8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (local_1e0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_1e0.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_004888b2:
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  DescriptorPool::~DescriptorPool(&pool);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3Extension) {
  // Valid for options.
  DescriptorPool pool;
  FileDescriptorProto file_proto;
  // Add "google/protobuf/descriptor.proto".
  FileDescriptorProto::descriptor()->file()->CopyTo(&file_proto);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);
  // Add "foo.proto":
  //   import "google/protobuf/descriptor.proto";
  //   extend google.protobuf.FileOptions {
  //     optional string test_file_opt = 1001;
  //   }
  //   extend google.protobuf.MessageOptions {
  //     optional string test_msg_opt = 1002;
  //   }
  //   extend google.protobuf.FieldOptions {
  //     optional string test_field_opt = 1003;
  //   }
  //   extend google.protobuf.EnumOptions {
  //     repeated int32 test_enum_opt = 1004;
  //   }
  //   extend google.protobuf.EnumValueOptions {
  //     optional int32 test_enumval_opt = 1005;
  //   }
  //   extend google.protobuf.ServiceOptions {
  //     repeated int32 test_svc_opt = 1006;
  //   }
  //   extend google.protobuf.MethodOptions {
  //     optional string test_method_opt = 1007;
  //   }
  //   extend google.protobuf.OneofOptions {
  //     optional string test_oneof_opt = 1008;
  //   }
  //   extend google.protobuf.ExtensionRangeOptions {
  //     optional string test_ext_opt = 1009;
  //   }
  file_proto.Clear();
  file_proto.set_name("foo.proto");
  file_proto.set_syntax("proto3");
  file_proto.add_dependency("google/protobuf/descriptor.proto");
  AddExtension(&file_proto, "google.protobuf.FileOptions", "test_file_opt", 1001,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.MessageOptions", "test_msg_opt", 1001,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.FieldOptions", "test_field_opt", 1003,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.EnumOptions", "test_enum_opt", 1004,
               FieldDescriptorProto::LABEL_REPEATED,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.EnumValueOptions", "test_enumval_opt", 1005,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.ServiceOptions", "test_svc_opt", 1006,
               FieldDescriptorProto::LABEL_REPEATED,
               FieldDescriptorProto::TYPE_INT32);
  AddExtension(&file_proto, "google.protobuf.MethodOptions", "test_method_opt", 1007,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.OneofOptions", "test_oneof_opt", 1008,
               FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  AddExtension(&file_proto, "google.protobuf.ExtensionRangeOptions", "test_ext_opt",
               1009, FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_STRING);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);

  // Copy and change the package of the descriptor.proto
  BuildFile(
      "name: 'google.protobuf.proto' "
      "syntax: 'proto2' "
      "message_type { "
      "  name: 'Container' extension_range { start: 1 end: 1000 } "
      "}");
  BuildFileWithErrors(
      "name: 'bar.proto' "
      "syntax: 'proto3' "
      "dependency: 'google.protobuf.proto' "
      "extension { "
      "  name: 'bar' number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 "
      "  extendee: 'Container' "
      "}",
      "bar.proto: bar: EXTENDEE: Extensions in proto3 are only allowed for "
      "defining options.\n");
}